

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

ON_OffsetSurface * __thiscall
ON_OffsetSurface::operator=(ON_OffsetSurface *this,ON_OffsetSurface *src)

{
  ON_OffsetSurface *pOVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ON_Surface *pOVar10;
  
  if (this != src) {
    pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
    if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
      (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[4])();
    }
    this->m__pSrf = (ON_Surface *)0x0;
    if (src->m__pSrf == (ON_Surface *)0x0) {
      ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    }
    else {
      pOVar10 = ON_SurfaceProxy::DuplicateSurface(&src->super_ON_SurfaceProxy);
      this->m__pSrf = pOVar10;
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pOVar10);
    }
    pOVar10 = (src->m_offset_function).m_srf;
    uVar2 = *(undefined8 *)&(src->m_offset_function).field_0x8;
    uVar3 = *(undefined8 *)&(src->m_offset_function).field_0x10;
    uVar4 = *(undefined8 *)&(src->m_offset_function).field_0x18;
    uVar5 = *(undefined4 *)&(src->m_offset_function).field_0x24;
    bVar6 = (src->m_offset_function).m_bZeroSideDerivative[0];
    bVar7 = (src->m_offset_function).m_bZeroSideDerivative[1];
    bVar8 = (src->m_offset_function).m_bZeroSideDerivative[2];
    bVar9 = (src->m_offset_function).m_bZeroSideDerivative[3];
    *(undefined8 *)&(this->m_offset_function).field_0x1c =
         *(undefined8 *)&(src->m_offset_function).field_0x1c;
    *(undefined4 *)&(this->m_offset_function).field_0x24 = uVar5;
    (this->m_offset_function).m_bZeroSideDerivative[0] = bVar6;
    (this->m_offset_function).m_bZeroSideDerivative[1] = bVar7;
    (this->m_offset_function).m_bZeroSideDerivative[2] = bVar8;
    (this->m_offset_function).m_bZeroSideDerivative[3] = bVar9;
    *(undefined8 *)&(this->m_offset_function).field_0x10 = uVar3;
    *(undefined8 *)&(this->m_offset_function).field_0x18 = uVar4;
    (this->m_offset_function).m_srf = pOVar10;
    *(undefined8 *)&(this->m_offset_function).field_0x8 = uVar2;
    ON_SimpleArray<ON_OffsetSurfaceValue>::operator=
              (&(this->m_offset_function).m_offset_value,&(src->m_offset_function).m_offset_value);
    ON_SimpleArray<ON_BumpFunction>::operator=
              (&(this->m_offset_function).m_bumps,&(src->m_offset_function).m_bumps);
    (this->m_offset_function).m_bValid = (src->m_offset_function).m_bValid;
    pOVar10 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
    ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar10);
  }
  return this;
}

Assistant:

ON_OffsetSurface& ON_OffsetSurface::operator=(const ON_OffsetSurface& src)
{
  if ( this != &src )
  {
    if ( 0 != m__pSrf && this != m__pSrf )
      delete m__pSrf;
    m__pSrf = 0;
    if ( 0 != src.m__pSrf )
    {
      m__pSrf = src.ON_SurfaceProxy::DuplicateSurface();
      SetProxySurface(m__pSrf);
    }
    else
    {
      ON_SurfaceProxy::operator=(src);
    }
    m_offset_function = src.m_offset_function;
    m_offset_function.SetBaseSurface( BaseSurface() );
  }
  return *this;
}